

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

SmallBuffer *
helics::emptyBlock(SmallBuffer *__return_storage_ptr__,DataType outputType,DataType inputType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  NamedPoint local_88;
  string local_60;
  double local_40;
  undefined1 *local_38;
  code *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  switch(outputType) {
  case HELICS_STRING:
  case HELICS_CHAR:
    if (inputType == HELICS_VECTOR) {
      local_88.name._M_dataplus._M_p = (pointer)0x0;
      local_88.name._M_string_length = 0;
      local_88.name.field_2._M_allocated_capacity =
           (long)
           "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
           + 0x5f;
      local_88.name.field_2._8_8_ = 1;
      local_30 = ::fmt::v11::detail::value<fmt::v11::context>::
                 format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,char>,char,void>>
      ;
      fmt_00.size_ = 0xf;
      fmt_00.data_ = (char *)0x4;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_38;
      local_38 = (undefined1 *)&local_88;
      ::fmt::v11::vformat_abi_cxx11_(&local_60,(v11 *)0x3c7325,fmt_00,args_00);
      local_28._M_len = local_60._M_string_length;
      local_28._M_str = local_60._M_dataplus._M_p;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                (__return_storage_ptr__,&local_28);
    }
    else {
      if (inputType != HELICS_COMPLEX_VECTOR) {
        if (inputType == HELICS_NAMED_POINT) goto switchD_002246a6_caseD_7;
        local_88.name._M_dataplus._M_p = (pointer)0x0;
        local_88.name._M_string_length = 0x3c72c1;
        goto LAB_002248c9;
      }
      local_88.name._M_dataplus._M_p = (pointer)0x0;
      local_88.name._M_string_length = 0;
      local_88.name.field_2._M_allocated_capacity =
           (long)
           "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
           + 0x5f;
      local_88.name.field_2._8_8_ = 1;
      local_30 = ::fmt::v11::detail::value<fmt::v11::context>::
                 format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,char,void>>
      ;
      fmt.size_ = 0xf;
      fmt.data_ = (char *)0x4;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_38;
      local_38 = (undefined1 *)&local_88;
      ::fmt::v11::vformat_abi_cxx11_(&local_60,(v11 *)0x3c7325,fmt,args);
      local_28._M_len = local_60._M_string_length;
      local_28._M_str = local_60._M_dataplus._M_p;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                (__return_storage_ptr__,&local_28);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002248ae;
  default:
    local_88.name._M_dataplus._M_p = (pointer)0x0;
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&local_88);
    break;
  case HELICS_INT:
  case HELICS_TIME:
    local_88.name._M_dataplus._M_p = (pointer)0x0;
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_88);
    break;
  case HELICS_COMPLEX:
    local_88.name._M_dataplus._M_p = (pointer)0x0;
    local_88.name._M_string_length = 0;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_88);
    break;
  case HELICS_VECTOR:
    local_88.name._M_dataplus._M_p = (pointer)0x0;
    local_88.name._M_string_length = 0;
    local_88.name.field_2._M_allocated_capacity = 0;
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_88);
    goto LAB_00224724;
  case HELICS_COMPLEX_VECTOR:
    local_88.name._M_dataplus._M_p = (pointer)0x0;
    local_88.name._M_string_length = 0;
    local_88.name.field_2._M_allocated_capacity = 0;
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_88);
LAB_00224724:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.name._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return __return_storage_ptr__;
    }
    pcVar2 = (char *)(local_88.name.field_2._M_allocated_capacity -
                     (long)local_88.name._M_dataplus._M_p);
    local_60._M_dataplus._M_p = local_88.name._M_dataplus._M_p;
    goto LAB_002248b1;
  case HELICS_NAMED_POINT:
    local_40 = nan("0");
    paVar1 = &local_88.name.field_2;
    local_88.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    local_88.value = local_40;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_88);
    local_60.field_2._M_allocated_capacity = local_88.name.field_2._M_allocated_capacity;
    local_60._M_dataplus._M_p = local_88.name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.name._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
LAB_002248ae:
    pcVar2 = (char *)(local_60.field_2._M_allocated_capacity + 1);
LAB_002248b1:
    operator_delete(local_60._M_dataplus._M_p,(ulong)pcVar2);
    break;
  case HELICS_BOOL:
switchD_002246a6_caseD_7:
    local_88.name._M_dataplus._M_p = (pointer)0x1;
    local_88.name._M_string_length = 0x3ead26;
LAB_002248c9:
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_88)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer emptyBlock(DataType outputType, DataType inputType = DataType::HELICS_ANY)
{
    switch (outputType) {
        case DataType::HELICS_DOUBLE:
        default:
            return ValueConverter<double>::convert(0.0);
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(0);
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(std::complex<double>(0.0, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert("0");
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{"", std::nan("0")});
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            switch (inputType) {
                default:
                    return ValueConverter<std::string_view>::convert("");
                case DataType::HELICS_VECTOR:
                    return ValueConverter<std::string_view>::convert(
                        helicsVectorString(std::vector<double>()));
                case DataType::HELICS_COMPLEX_VECTOR:
                    return ValueConverter<std::string_view>::convert(
                        helicsComplexVectorString(std::vector<std::complex<double>>()));
                case DataType::HELICS_NAMED_POINT:
                    return ValueConverter<std::string_view>::convert("0");
            }
        case DataType::HELICS_COMPLEX_VECTOR: {
            return ValueConverter<std::vector<std::complex<double>>>::convert(
                std::vector<std::complex<double>>());
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<std::vector<double>>::convert(std::vector<double>());
    }
}